

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

void __thiscall Disk::Disk(Disk *this,Format *fmt_)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  FdcType FVar3;
  DataRate DVar4;
  Encoding EVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint8_t uVar16;
  bool bVar17;
  undefined2 uVar18;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  this->_vptr_Disk = (_func_int **)&PTR__Disk_001dcfd0;
  iVar2 = fmt_->heads;
  FVar3 = fmt_->fdc;
  DVar4 = fmt_->datarate;
  EVar5 = fmt_->encoding;
  iVar6 = fmt_->sectors;
  iVar7 = fmt_->size;
  iVar8 = fmt_->base;
  iVar9 = fmt_->offset;
  iVar10 = fmt_->interleave;
  iVar11 = fmt_->skew;
  iVar12 = fmt_->head0;
  iVar13 = fmt_->head0;
  iVar14 = fmt_->head1;
  iVar15 = fmt_->gap3;
  uVar16 = fmt_->fill;
  bVar17 = fmt_->cyls_first;
  uVar18 = *(undefined2 *)&fmt_->field_0x3a;
  (this->fmt).cyls = fmt_->cyls;
  (this->fmt).heads = iVar2;
  (this->fmt).fdc = FVar3;
  (this->fmt).datarate = DVar4;
  (this->fmt).encoding = EVar5;
  (this->fmt).sectors = iVar6;
  (this->fmt).size = iVar7;
  (this->fmt).base = iVar8;
  (this->fmt).offset = iVar9;
  (this->fmt).interleave = iVar10;
  (this->fmt).skew = iVar11;
  (this->fmt).head0 = iVar12;
  (this->fmt).head0 = iVar13;
  (this->fmt).head1 = iVar14;
  (this->fmt).gap3 = iVar15;
  (this->fmt).fill = uVar16;
  (this->fmt).cyls_first = bVar17;
  *(undefined2 *)&(this->fmt).field_0x3a = uVar18;
  p_Var1 = &(this->metadata)._M_t._M_impl.super__Rb_tree_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->strType,"<unknown>",(allocator<char> *)&local_38);
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format(this,&this->fmt,(Data *)&local_38,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

Disk::Disk(Format& fmt_)
    : fmt(fmt_)
{
    format(fmt);
}